

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

int scan_tsv(Scanner *s,char *stop)

{
  char cVar1;
  int in_EAX;
  byte *pbVar2;
  byte *pbVar4;
  long lVar5;
  bool bVar6;
  byte *pbVar3;
  
  pbVar3 = (byte *)s->cur;
LAB_0010a386:
  if (stop <= pbVar3) {
    return 0;
  }
  s->start = (char *)pbVar3;
  pbVar2 = pbVar3;
  pbVar4 = pbVar3;
  switch(*pbVar3) {
  case 0:
    pbVar2 = pbVar3 + 1;
    in_EAX = 4;
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
  case 0x7f:
    goto switchD_0010a3aa_caseD_1;
  case 8:
  case 0xc:
  case 0x22:
  case 0x5c:
    pbVar2 = pbVar3 + 1;
    in_EAX = 2;
    break;
  case 9:
    pbVar2 = pbVar3 + 1;
    in_EAX = 5;
    break;
  case 10:
    goto switchD_0010a3aa_caseD_a;
  case 0xd:
    pbVar2 = pbVar3 + 1;
    s->cur = (char *)pbVar2;
    if (pbVar3[1] != 10) {
      in_EAX = 3;
      goto LAB_0010a3e7;
    }
    goto switchD_0010a3aa_caseD_a;
  case 0x2d:
    pbVar2 = pbVar3 + 1;
    s->cur = (char *)pbVar2;
    if ((pbVar3[1] - 0x30 < 10) || (bVar6 = true, pbVar3[1] == 0x2e)) goto LAB_0010a3ca;
    goto LAB_0010a3ba;
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
LAB_0010a3ca:
    do {
      do {
        pbVar2 = pbVar2 + 1;
        s->cur = (char *)pbVar2;
      } while (*pbVar2 - 0x30 < 10);
    } while (*pbVar2 == 0x2e);
    in_EAX = 7;
LAB_0010a3e7:
    bVar6 = false;
    goto LAB_0010a3ba;
  case 0x66:
    pbVar2 = pbVar3 + 1;
    s->cur = (char *)pbVar2;
    s->ptr = (char *)pbVar2;
    bVar6 = true;
    if (pbVar3[1] != 0x61) goto LAB_0010a3ba;
    s->cur = (char *)(pbVar3 + 2);
    if ((pbVar3[2] != 0x6c) || (s->cur = (char *)(pbVar3 + 3), pbVar3[3] != 0x73))
    goto switchD_0010a3aa_caseD_80;
    s->cur = (char *)(pbVar3 + 4);
    lVar5 = 4;
    if (pbVar3[4] != 0x65) goto switchD_0010a3aa_caseD_80;
LAB_0010a49f:
    pbVar2 = pbVar3 + lVar5 + 1;
    in_EAX = 7;
    bVar6 = false;
    goto LAB_0010a3b6;
  case 0x74:
    pbVar2 = pbVar3 + 1;
    s->cur = (char *)pbVar2;
    s->ptr = (char *)pbVar2;
    bVar6 = true;
    if (pbVar3[1] != 0x72) goto LAB_0010a3ba;
    s->cur = (char *)(pbVar3 + 2);
    if (pbVar3[2] == 0x75) {
      s->cur = (char *)(pbVar3 + 3);
      lVar5 = 3;
      if (pbVar3[3] == 0x65) goto LAB_0010a49f;
    }
  default:
    goto switchD_0010a3aa_caseD_80;
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
    goto switchD_0010a3aa_caseD_c2;
  case 0xe0:
    pbVar4 = pbVar3 + 1;
    s->cur = (char *)pbVar4;
    if ((pbVar3[1] & 0xe0) == 0xa0) goto switchD_0010a3aa_caseD_c2;
    goto switchD_0010a3aa_caseD_80;
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
    goto switchD_0010a3aa_caseD_e1;
  case 0xf0:
    pbVar2 = pbVar3 + 1;
    s->cur = (char *)pbVar2;
    if ((byte)(pbVar3[1] + 0x70) < 0x30) goto switchD_0010a3aa_caseD_e1;
switchD_0010a3aa_caseD_80:
    pbVar2 = (byte *)s->ptr;
    bVar6 = true;
    goto LAB_0010a3b6;
  case 0xf1:
  case 0xf2:
  case 0xf3:
    s->cur = (char *)(pbVar3 + 1);
    bVar6 = SBORROW1(pbVar3[1],-0x40);
    cVar1 = pbVar3[1] + 0x40;
    goto LAB_0010a539;
  case 0xf4:
    s->cur = (char *)(pbVar3 + 1);
    bVar6 = SBORROW1(pbVar3[1],-0x70);
    cVar1 = pbVar3[1] + 0x70;
LAB_0010a539:
    pbVar2 = pbVar3 + 1;
    if (bVar6 == cVar1 < '\0') goto switchD_0010a3aa_caseD_80;
switchD_0010a3aa_caseD_e1:
    pbVar4 = pbVar2 + 1;
    s->cur = (char *)pbVar4;
    if (-0x41 < (char)pbVar2[1]) goto switchD_0010a3aa_caseD_80;
switchD_0010a3aa_caseD_c2:
    pbVar3 = pbVar4 + 1;
    s->cur = (char *)pbVar3;
    if (-0x41 < (char)pbVar4[1]) goto switchD_0010a3aa_caseD_80;
switchD_0010a3aa_caseD_1:
    pbVar2 = pbVar3 + 1;
    bVar6 = true;
    goto LAB_0010a3b6;
  }
LAB_0010a525:
  bVar6 = false;
LAB_0010a3b6:
  s->cur = (char *)pbVar2;
LAB_0010a3ba:
  pbVar3 = pbVar2;
  if (!bVar6) {
    return in_EAX;
  }
  goto LAB_0010a386;
switchD_0010a3aa_caseD_a:
  pbVar2 = pbVar2 + 1;
  in_EAX = 3;
  goto LAB_0010a525;
}

Assistant:

int scan_tsv(Scanner * s, const char * stop) {

scan:

	if (s->cur >= stop) {
		return 0;
	}

	s->start = s->cur;


	{
		YYCTYPE yych;
		yych = *YYCURSOR;

		switch (yych) {
			case 0x00:
				goto yy53;

			case 0x01:
			case 0x02:
			case 0x03:
			case 0x04:
			case 0x05:
			case 0x06:
			case 0x07:
			case '\v':
			case 0x0E:
			case 0x0F:
			case 0x10:
			case 0x11:
			case 0x12:
			case 0x13:
			case 0x14:
			case 0x15:
			case 0x16:
			case 0x17:
			case 0x18:
			case 0x19:
			case 0x1A:
			case 0x1B:
			case 0x1C:
			case 0x1D:
			case 0x1E:
			case 0x1F:
			case ' ':
			case '!':
			case '#':
			case '$':
			case '%':
			case '&':
			case '\'':
			case '(':
			case ')':
			case '*':
			case '+':
			case ',':
			case '/':
			case ':':
			case ';':
			case '<':
			case '=':
			case '>':
			case '?':
			case '@':
			case 'A':
			case 'B':
			case 'C':
			case 'D':
			case 'E':
			case 'F':
			case 'G':
			case 'H':
			case 'I':
			case 'J':
			case 'K':
			case 'L':
			case 'M':
			case 'N':
			case 'O':
			case 'P':
			case 'Q':
			case 'R':
			case 'S':
			case 'T':
			case 'U':
			case 'V':
			case 'W':
			case 'X':
			case 'Y':
			case 'Z':
			case '[':
			case ']':
			case '^':
			case '_':
			case '`':
			case 'a':
			case 'b':
			case 'c':
			case 'd':
			case 'e':
			case 'g':
			case 'h':
			case 'i':
			case 'j':
			case 'k':
			case 'l':
			case 'm':
			case 'n':
			case 'o':
			case 'p':
			case 'q':
			case 'r':
			case 's':
			case 'u':
			case 'v':
			case 'w':
			case 'x':
			case 'y':
			case 'z':
			case '{':
			case '|':
			case '}':
			case '~':
			case 0x7F:
				goto yy68;

			case 0x08:
				goto yy62;

			case '\t':
				goto yy58;

			case '\n':
				goto yy55;

			case '\f':
				goto yy64;

			case '\r':
				goto yy57;

			case '"':
				goto yy66;

			case '-':
				goto yy47;

			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy49;

			case '\\':
				goto yy60;

			case 'f':
				goto yy52;

			case 't':
				goto yy51;

			case 0xC2:
			case 0xC3:
			case 0xC4:
			case 0xC5:
			case 0xC6:
			case 0xC7:
			case 0xC8:
			case 0xC9:
			case 0xCA:
			case 0xCB:
			case 0xCC:
			case 0xCD:
			case 0xCE:
			case 0xCF:
			case 0xD0:
			case 0xD1:
			case 0xD2:
			case 0xD3:
			case 0xD4:
			case 0xD5:
			case 0xD6:
			case 0xD7:
			case 0xD8:
			case 0xD9:
			case 0xDA:
			case 0xDB:
			case 0xDC:
			case 0xDD:
			case 0xDE:
			case 0xDF:
				goto yy69;

			case 0xE0:
				goto yy70;

			case 0xE1:
			case 0xE2:
			case 0xE3:
			case 0xE4:
			case 0xE5:
			case 0xE6:
			case 0xE7:
			case 0xE8:
			case 0xE9:
			case 0xEA:
			case 0xEB:
			case 0xEC:
			case 0xED:
			case 0xEE:
			case 0xEF:
				goto yy71;

			case 0xF0:
				goto yy72;

			case 0xF1:
			case 0xF2:
			case 0xF3:
				goto yy73;

			case 0xF4:
				goto yy74;

			default:
				goto yy46;
		}

yy46:
		YYCURSOR = YYMARKER;
		goto yy48;
yy47:
		++YYCURSOR;

		switch ((yych = *YYCURSOR)) {
			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy82;

			default:
				goto yy48;
		}

yy48: {
			goto scan;
		}
yy49:
		++YYCURSOR;
		yych = *YYCURSOR;
		goto yy83;
yy50: {
			return TEXT_NUMERIC;
		}
yy51:
		yych = *(YYMARKER = ++YYCURSOR);

		switch (yych) {
			case 'r':
				goto yy80;

			default:
				goto yy48;
		}

yy52:
		yych = *(YYMARKER = ++YYCURSOR);

		switch (yych) {
			case 'a':
				goto yy75;

			default:
				goto yy48;
		}

yy53:
		++YYCURSOR;
		{
			return TDP_EOF;
		}
yy55:
		++YYCURSOR;
yy56: {
			return RECORD_DELIMITER;
		}
yy57:
		yych = *++YYCURSOR;

		switch (yych) {
			case '\n':
				goto yy55;

			default:
				goto yy56;
		}

yy58:
		++YYCURSOR;
		{
			return FIELD_DELIMITER;
		}
yy60:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy62:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy64:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy66:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy68:
		yych = *++YYCURSOR;
		goto yy48;
yy69:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy68;

			default:
				goto yy46;
		}

yy70:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy69;

			default:
				goto yy46;
		}

yy71:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy69;

			default:
				goto yy46;
		}

yy72:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy71;

			default:
				goto yy46;
		}

yy73:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy71;

			default:
				goto yy46;
		}

yy74:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
				goto yy71;

			default:
				goto yy46;
		}

yy75:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'l':
				goto yy76;

			default:
				goto yy46;
		}

yy76:
		yych = *++YYCURSOR;

		switch (yych) {
			case 's':
				goto yy77;

			default:
				goto yy46;
		}

yy77:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'e':
				goto yy78;

			default:
				goto yy46;
		}

yy78:
		++YYCURSOR;
		{
			return TEXT_NUMERIC;
		}
yy80:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'u':
				goto yy81;

			default:
				goto yy46;
		}

yy81:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'e':
				goto yy78;

			default:
				goto yy46;
		}

yy82:
		++YYCURSOR;
		yych = *YYCURSOR;
yy83:

		switch (yych) {
			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy82;

			default:
				goto yy50;
		}
	}

}